

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_time.c
# Opt level: O3

int p2sc_string2date(char *iso_date,double *d)

{
  char *pcVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  char cVar10;
  int iVar11;
  long lVar12;
  byte *pbVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  char *local_48;
  long local_40;
  double *local_38;
  
  lVar9 = _g_ascii_table;
  local_48 = iso_date + -1;
  do {
    bVar2 = local_48[1];
    local_48 = local_48 + 1;
    uVar3 = *(ushort *)(_g_ascii_table + (ulong)bVar2 * 2);
  } while ((uVar3 >> 8 & 1) != 0);
  iVar11 = -1;
  if ((bVar2 != 0) && ((((uVar3 & 8) != 0 || (bVar2 == 0x2d)) || (bVar2 == 0x2b)))) {
    lVar4 = strtol(local_48,&local_48,10);
    cVar10 = *local_48;
    if (cVar10 == '-') {
      local_48 = local_48 + 1;
      local_40 = strtol(local_48,&local_48,10);
      pcVar1 = local_48 + 1;
      if (*local_48 != '-') {
        return -1;
      }
      local_48 = pcVar1;
      lVar5 = strtol(pcVar1,&local_48,10);
      cVar10 = *local_48;
      lVar15 = lVar4;
    }
    else {
      lVar5 = lVar4 % 100;
      lVar15 = lVar4 / 10000;
      local_40 = (long)((int)(short)((short)lVar4 + (short)lVar15 * -10000) / 100);
    }
    local_48 = local_48 + 1;
    if (cVar10 == 'T') {
      local_38 = d;
      lVar4 = strtol(local_48,&local_48,10);
      cVar10 = *local_48;
      if (cVar10 == ':') {
        local_48 = local_48 + 1;
        lVar6 = strtol(local_48,&local_48,10);
        pcVar1 = local_48 + 1;
        if (*local_48 != ':') {
          return -1;
        }
        local_48 = pcVar1;
        lVar7 = strtol(pcVar1,&local_48,10);
        cVar10 = *local_48;
        lVar14 = lVar4;
      }
      else {
        lVar7 = lVar4 % 100;
        lVar14 = lVar4 / 10000;
        lVar6 = (long)((int)(short)((short)lVar4 + (short)lVar14 * -10000) / 100);
      }
      dVar16 = 0.0;
      if (cVar10 == '.') {
        uVar8 = (ulong)(byte)local_48[1];
        if ((*(byte *)(lVar9 + uVar8 * 2) & 8) == 0) {
          lVar12 = 0;
        }
        else {
          pbVar13 = (byte *)(local_48 + 2);
          lVar4 = 100000;
          lVar12 = 0;
          do {
            lVar12 = lVar12 + ((long)(char)uVar8 + -0x30) * lVar4;
            lVar4 = lVar4 / 10;
            uVar8 = (ulong)*pbVar13;
            pbVar13 = pbVar13 + 1;
          } while ((*(byte *)(lVar9 + uVar8 * 2) & 8) != 0);
        }
        lVar9 = -lVar12;
        if (-1 < lVar7) {
          lVar9 = lVar12;
        }
        dVar16 = (double)lVar9;
      }
      *local_38 = (double)lVar15;
      local_38[1] = (double)local_40;
      local_38[2] = (double)lVar5;
      local_38[3] = (double)lVar14;
      local_38[4] = (double)lVar6;
      local_38[5] = dVar16 / 1000000.0 + (double)lVar7;
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int p2sc_string2date(const char *iso_date, double d[6]) {
    char *date = (char *) iso_date;
    long year, mon, mday, hour, min, sec, usec = 0;
    long val;

    while (g_ascii_isspace(*date))
        date++;

    if (*date == '\0')
        return -1;

    if (!g_ascii_isdigit(*date) && *date != '-' && *date != '+')
        return -1;

    val = strtol(date, &date, 10);
    if (*date == '-') {
        // YYYY-MM-DD
        year = val;
        date++;
        mon = strtol(date, &date, 10);

        if (*date++ != '-')
            return -1;

        mday = strtol(date, &date, 10);
    } else {
        // YYYYMMDD
        mday = val % 100;
        mon = (val % 10000) / 100;
        year = val / 10000;
    }

    if (*date++ != 'T')
        return -1;

    val = strtol(date, &date, 10);
    if (*date == ':') {
        // hh:mm:ss
        hour = val;
        date++;
        min = strtol(date, &date, 10);

        if (*date++ != ':')
            return -1;

        sec = strtol(date, &date, 10);
    } else {
        // hhmmss
        sec = val % 100;
        min = (val % 10000) / 100;
        hour = val / 10000;
    }

    if (*date == '.') {
        glong mul = 100000;

        while (g_ascii_isdigit(*++date)) {
            usec += (*date - '0') * mul;
            mul /= 10;
        }
        if (sec < 0)
            usec = -usec;
    }

    d[0] = year;
    d[1] = mon;
    d[2] = mday;
    d[3] = hour;
    d[4] = min;
    d[5] = sec + usec / 1000000.;

    return 0;
}